

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O2

void __thiscall VMScriptFunction::~VMScriptFunction(VMScriptFunction *this)

{
  VMOP *block;
  long lVar1;
  int i;
  ulong uVar2;
  
  (this->super_VMFunction).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_007ec358;
  block = this->Code;
  if (block != (VMOP *)0x0) {
    if (this->KonstS != (FString *)0x0) {
      lVar1 = 0;
      for (uVar2 = 0; uVar2 < this->NumKonstS; uVar2 = uVar2 + 1) {
        FString::~FString((FString *)((long)&this->KonstS->Chars + lVar1));
        lVar1 = lVar1 + 8;
      }
      block = this->Code;
    }
    M_Free(block);
  }
  DObject::~DObject((DObject *)this);
  return;
}

Assistant:

VMScriptFunction::~VMScriptFunction()
{
	if (Code != NULL)
	{
		if (KonstS != NULL)
		{
			for (int i = 0; i < NumKonstS; ++i)
			{
				KonstS[i].~FString();
			}
		}
		M_Free(Code);
	}
}